

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::Impl::remap_compute_pipeline_ci
          (Impl *this,VkComputePipelineCreateInfo *info)

{
  bool bVar1;
  
  bVar1 = remap_shader_module_handle(this,&info->stage);
  if (!bVar1) {
    return false;
  }
  if ((info->basePipelineHandle != (VkPipeline)0x0) &&
     (bVar1 = remap_compute_pipeline_handle(this,info->basePipelineHandle,&info->basePipelineHandle)
     , !bVar1)) {
    return false;
  }
  bVar1 = remap_pipeline_layout_handle(this,info->layout,&info->layout);
  return bVar1;
}

Assistant:

bool StateRecorder::Impl::remap_compute_pipeline_ci(VkComputePipelineCreateInfo *info)
{
	if (!remap_shader_module_handle(info->stage))
		return false;

	if (info->basePipelineHandle != VK_NULL_HANDLE)
		if (!remap_compute_pipeline_handle(info->basePipelineHandle, &info->basePipelineHandle))
			return false;

	if (!remap_pipeline_layout_handle(info->layout, &info->layout))
		return false;

	return true;
}